

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeData.cpp
# Opt level: O0

char16 * NativeCodeData::GetDataDescription(void *data,JitArenaAllocator *alloc)

{
  DataChunk *pDVar1;
  size_t sVar2;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this;
  TrackAllocData local_860;
  char16_t *local_838;
  char16_t *desc;
  size_t len;
  char16 buf [1024];
  DataChunk *chunk;
  JitArenaAllocator *alloc_local;
  void *data_local;
  
  pDVar1 = GetDataChunk(data);
  memset((WCHAR (*) [1024])&len,0,0x800);
  swprintf_s<1024ul>((WCHAR (*) [1024])&len,L"%hs, NativeCodeData: index: %x, len: %x, offset: +%x",
                     pDVar1->dataType,(ulong)pDVar1->allocIndex,(ulong)pDVar1->len,
                     (ulong)pDVar1->offset);
  sVar2 = PAL_wcslen((char16_t *)&len);
  desc = (char16_t *)(sVar2 + 1);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_860,(type_info *)&char16_t::typeinfo,0,(size_t)desc,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
             ,0x99);
  this = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                   ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)alloc,
                    &local_860);
  local_838 = Memory::AllocateArray<Memory::JitArenaAllocator,char16_t,false>
                        ((Memory *)this,(JitArenaAllocator *)Memory::JitArenaAllocator::Alloc,0,
                         (size_t)desc);
  wcscpy_s(local_838,(size_t)desc,(WCHAR *)&len);
  return local_838;
}

Assistant:

char16*
NativeCodeData::GetDataDescription(void* data, JitArenaAllocator * alloc)
{
    auto chunk = GetDataChunk(data);
    char16 buf[1024] = { 0 };
#if DBG
    swprintf_s(buf, _u("%hs, NativeCodeData: index: %x, len: %x, offset: +%x"), chunk->dataType, chunk->allocIndex, chunk->len, chunk->offset);
#else
    swprintf_s(buf, _u("NativeCodeData: index: %x, len: %x, offset: +%x"), chunk->allocIndex, chunk->len, chunk->offset);
#endif
    auto len = wcslen(buf) + 1;
    auto desc = JitAnewArray(alloc, char16, len);
    wcscpy_s(desc, len, buf);
    return desc;
}